

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__resample_row_generic(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc *psVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  
  psVar1 = out;
  if (0 < w) {
    auVar4 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar5 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar7 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar8 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f();
    uVar2 = 0;
    do {
      if (0 < hs) {
        auVar13 = vpbroadcastb_avx512bw(ZEXT116(in_near[uVar2]));
        uVar3 = 0;
        do {
          auVar14 = vpbroadcastq_avx512f();
          auVar15 = vporq_avx512f(auVar14,auVar4);
          auVar16 = vporq_avx512f(auVar14,auVar8);
          auVar17 = vporq_avx512f(auVar14,auVar10);
          auVar18 = vporq_avx512f(auVar14,auVar5);
          auVar19 = vporq_avx512f(auVar14,auVar6);
          auVar20 = vporq_avx512f(auVar14,auVar7);
          auVar21 = vporq_avx512f(auVar14,auVar9);
          auVar14 = vporq_avx512f(auVar14,auVar11);
          vpcmpuq_avx512f(auVar14,auVar12,2);
          vpcmpuq_avx512f(auVar17,auVar12,2);
          vpcmpuq_avx512f(auVar16,auVar12,2);
          vpcmpuq_avx512f(auVar15,auVar12,2);
          vpcmpuq_avx512f(auVar21,auVar12,2);
          vpcmpuq_avx512f(auVar19,auVar12,2);
          vpcmpuq_avx512f(auVar20,auVar12,2);
          vpcmpuq_avx512f(auVar18,auVar12,2);
          auVar14 = vmovdqu8_avx512bw(auVar13);
          *(undefined1 (*) [64])(out + uVar3) = auVar14;
          uVar3 = uVar3 + 0x40;
        } while ((hs + 0x3fU & 0xffffffc0) != uVar3);
      }
      uVar2 = uVar2 + 1;
      out = out + (uint)hs;
    } while (uVar2 != (uint)w);
  }
  return psVar1;
}

Assistant:

static stbi_uc *stbi__resample_row_generic(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // resample with nearest-neighbor
   int i,j;
   STBI_NOTUSED(in_far);
   for (i=0; i < w; ++i)
      for (j=0; j < hs; ++j)
         out[i*hs+j] = in_near[i];
   return out;
}